

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.c
# Opt level: O0

int get_bit_index(CB_Code opcode)

{
  byte bVar1;
  int local_1c;
  int row_index;
  uint8_t upper;
  int column_index;
  uint8_t lower;
  CB_Code opcode_local;
  
  bVar1 = (byte)opcode & 0xf0;
  local_1c = 6;
  if (((bVar1 == 0x40) || (bVar1 == 0x80)) || (bVar1 == 0xc0)) {
    local_1c = 0;
  }
  else if (((bVar1 == 0x50) || (bVar1 == 0x90)) || (bVar1 == 0xd0)) {
    local_1c = 2;
  }
  else if (((bVar1 == 0x60) || (bVar1 == 0xa0)) || (bVar1 == 0xe0)) {
    local_1c = 4;
  }
  return (uint)(7 < ((byte)opcode & 0xf)) + local_1c;
}

Assistant:

int get_bit_index(CB_Code opcode) {
    
    uint8_t lower = (uint8_t)(opcode) & 0x0F;
    int column_index = lower <= 0x07 ? 0 : 1;

    uint8_t upper = (uint8_t) (opcode) & 0xF0;

    int row_index = 6;
    if(upper == 0x40 || upper == 0x80 || upper == 0xC0) {
        row_index = 0;
    } else if(upper == 0x50 || upper == 0x90 || upper == 0xD0) {
        row_index = 2;
    } else if(upper == 0x60 || upper == 0xA0 || upper == 0xE0) {
        row_index = 4;
    }  

    return column_index + row_index;
}